

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O3

void __thiscall Client::requestAccessToken(Client *this)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined2 *puVar3;
  double dVar4;
  undefined8 uVar5;
  logger *this_00;
  long *plVar6;
  undefined8 *puVar7;
  const_reference pvVar8;
  long lVar9;
  Response *pRVar10;
  long *plVar11;
  ulong *puVar12;
  Error extraout_EDX;
  Error extraout_EDX_00;
  Error extraout_EDX_01;
  Error error;
  long lVar13;
  undefined8 uVar14;
  ulong uVar15;
  Json resultJson;
  unsigned_long ret;
  Result result;
  string __str;
  string data;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [24];
  undefined3 local_170;
  undefined5 uStack_16d;
  _Base_ptr local_168;
  size_t local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [80];
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  this_00 = spdlog::default_logger_raw();
  local_158._0_8_ = (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0
  ;
  local_158._8_8_ = 0;
  local_148._0_8_ = 0;
  dVar4 = spdlog::logger::log(this_00,0.0);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>(SUB84(dVar4,0),&local_f8,"grant_type=password","")
  ;
  pcVar2 = local_188 + 0x10;
  local_188._16_8_ = (_Base_ptr)0x6d616e7265737526;
  local_188._8_8_ = 10;
  local_170 = 0x3d65;
  local_188._0_8_ = pcVar2;
  plVar6 = (long *)std::__cxx11::string::append(local_188);
  pRVar10 = (Response *)(plVar6 + 2);
  if ((Response *)*plVar6 == pRVar10) {
    local_148._0_8_ = (pRVar10->version)._M_dataplus._M_p;
    local_148._8_8_ = plVar6[3];
    local_158._0_8_ = (Response *)(local_158 + 0x10);
  }
  else {
    local_148._0_8_ = (pRVar10->version)._M_dataplus._M_p;
    local_158._0_8_ = (Response *)*plVar6;
  }
  local_158._8_8_ = plVar6[1];
  *plVar6 = (long)pRVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_f8,local_158._0_8_);
  if ((Response *)local_158._0_8_ != (Response *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
  }
  if ((pointer)local_188._0_8_ != pcVar2) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  local_188._16_8_ = (_Base_ptr)0x726f777373617026;
  local_188._8_8_ = 10;
  local_170 = 0x3d64;
  local_188._0_8_ = pcVar2;
  plVar6 = (long *)std::__cxx11::string::append(local_188);
  pRVar10 = (Response *)(plVar6 + 2);
  if ((Response *)*plVar6 == pRVar10) {
    local_148._0_8_ = (pRVar10->version)._M_dataplus._M_p;
    local_148._8_8_ = plVar6[3];
    local_158._0_8_ = (Response *)(local_158 + 0x10);
  }
  else {
    local_148._0_8_ = (pRVar10->version)._M_dataplus._M_p;
    local_158._0_8_ = (Response *)*plVar6;
  }
  local_158._8_8_ = plVar6[1];
  *plVar6 = (long)pRVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_f8,local_158._0_8_);
  if ((Response *)local_158._0_8_ != (Response *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_148._0_8_ + 1));
  }
  if ((pointer)local_188._0_8_ != pcVar2) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"/api/v1/access_token","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"application/x-www-form-urlencoded","");
  _local_170 = local_188 + 8;
  local_188._16_8_ = (_Base_ptr)0x0;
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = 0;
  local_160 = 0;
  local_168 = (_Base_ptr)_local_170;
  httplib::ClientImpl::Post
            ((Result *)local_158,
             (this->tokenClient).cli_._M_t.
             super___uniq_ptr_impl<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>_>.
             _M_t.
             super__Tuple_impl<0UL,_httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>
             .super__Head_base<0UL,_httplib::ClientImpl_*,_false>._M_head_impl,&local_1c8,
             (Headers *)local_188,&local_f8,&local_1a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_188);
  error = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    error = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    error = extraout_EDX_01;
  }
  uVar5 = local_158._0_8_;
  httplib::to_string_abi_cxx11_((string *)local_188,(httplib *)(local_158._8_8_ & 0xffffffff),error)
  ;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"File: ","");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_78);
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_a8 = *plVar11;
    lStack_a0 = plVar6[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar11;
    local_b8 = (long *)*plVar6;
  }
  local_b0 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_88 = *plVar11;
    lStack_80 = plVar6[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar11;
    local_98 = (long *)*plVar6;
  }
  local_90 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_d8 = &local_c8;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_c8 = *plVar11;
    lStack_c0 = plVar6[3];
  }
  else {
    local_c8 = *plVar11;
    local_d8 = (long *)*plVar6;
  }
  local_d0 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  puVar12 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_1a8.field_2._M_allocated_capacity = *puVar12;
    local_1a8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_1a8.field_2._M_allocated_capacity = *puVar12;
    local_1a8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1a8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar3 = (undefined2 *)(local_148 + 0x40);
  local_148._48_8_ = puVar3;
  std::__cxx11::string::_M_construct((ulong)(local_148 + 0x30),'\x02');
  *(undefined2 *)local_148._48_8_ = 0x3339;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    uVar14 = local_1a8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_148._56_8_ + local_1a8._M_string_length) {
    uVar15 = 0xf;
    if ((undefined2 *)local_148._48_8_ != puVar3) {
      uVar15 = local_148._64_8_;
    }
    if (local_148._56_8_ + local_1a8._M_string_length <= uVar15) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)(local_148 + 0x30),0,(char *)0x0,(ulong)local_1a8._M_dataplus._M_p)
      ;
      goto LAB_00116d97;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a8,local_148._48_8_);
LAB_00116d97:
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1c8.field_2._M_allocated_capacity = *psVar1;
    local_1c8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar1;
    local_1c8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_1c8._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            ((Response *)uVar5 != (Response *)0x0,(char (*) [14])"Error state: ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
             (char (*) [2])0x173c61,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined2 *)local_148._48_8_ != puVar3) {
    operator_delete((void *)local_148._48_8_,local_148._64_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  check<std::__cxx11::string_const&>
            (*(int *)(local_158._0_8_ + 0x20) == 200,(string *)(local_158._0_8_ + 0x28));
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string_const&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_1c8,(string *)(local_158._0_8_ + 0x78),(parser_callback_t *)&local_58,true,
             false);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pvVar8 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_1c8,"access_token");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_188,pvVar8);
  std::__cxx11::string::operator=((string *)&this->accessToken,(string *)local_188);
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  pvVar8 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_1c8,"expires_in");
  local_188._0_8_ = (pointer)0x0;
  nlohmann::json_abi_v3_11_2::detail::
  get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
            (pvVar8,(unsigned_long *)local_188);
  lVar13 = local_188._0_8_ * 1000000000;
  lVar9 = std::chrono::_V2::system_clock::now();
  (this->accessTokenExpiration).__d.__r = lVar9 + -10000000000 + lVar13;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_1c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_158 + 0x10));
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void requestAccessToken() {
        spdlog::info("Requesting new access token");

        std::string data = "grant_type=password";
        data += "&username="s + bot_name;
        data += "&password="s + bot_password;

        const httplib::Result result = tokenClient.Post("/api/v1/access_token", data, "application/x-www-form-urlencoded");
        check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
        check(result->status == 200, result->reason);

        const Json resultJson = Json::parse(result->body);

        accessToken = resultJson["access_token"].get<std::string>();
        accessTokenExpiration = std::chrono::seconds(resultJson["expires_in"].get<size_t>()) + Clock::now() - std::chrono::seconds(10);
    }